

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::PropertyIdOnRegSlotsContainer::Insert
          (PropertyIdOnRegSlotsContainer *this,RegSlot reg,PropertyId propId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int *piVar4;
  
  if ((this->propertyIdsForRegSlots).ptr == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1610,"(propertyIdsForRegSlots)","propertyIdsForRegSlots");
    if (!bVar2) goto LAB_006d0e81;
    *puVar3 = 0;
  }
  if (this->length <= reg) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1611,"(reg < length)","reg < length");
    if (!bVar2) goto LAB_006d0e81;
    *puVar3 = 0;
  }
  piVar4 = (this->propertyIdsForRegSlots).ptr;
  if (piVar4[reg] != propId && piVar4[reg] != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1616,
                                "(propertyIdsForRegSlots[reg] == 0 || propertyIdsForRegSlots[reg] == propId)"
                                ,
                                "propertyIdsForRegSlots[reg] == 0 || propertyIdsForRegSlots[reg] == propId"
                               );
    if (!bVar2) {
LAB_006d0e81:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    piVar4 = (this->propertyIdsForRegSlots).ptr;
  }
  piVar4[reg] = propId;
  return;
}

Assistant:

void PropertyIdOnRegSlotsContainer::Insert(RegSlot reg, PropertyId propId)
    {
        //
        // Reg is being used as an index;

        Assert(propertyIdsForRegSlots);
        Assert(reg < length);

        //
        // the current reg is unaccounted for const reg count. while fetching calculate the actual regslot value.

        Assert(propertyIdsForRegSlots[reg] == 0 || propertyIdsForRegSlots[reg] == propId);
        propertyIdsForRegSlots[reg] = propId;
    }